

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [32];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [64];
  uint uVar67;
  uint uVar68;
  undefined1 auVar66 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined4 uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2870 [16];
  long local_2858;
  long local_2850;
  ulong local_2848;
  Scene *local_2840;
  undefined1 (*local_2838) [16];
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar28;
  
  pauVar38 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar84 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = fVar2;
  local_23e0._0_4_ = fVar2;
  local_23e0._8_4_ = fVar2;
  local_23e0._12_4_ = fVar2;
  local_23e0._16_4_ = fVar2;
  local_23e0._20_4_ = fVar2;
  local_23e0._24_4_ = fVar2;
  local_23e0._28_4_ = fVar2;
  auVar59 = ZEXT3264(local_23e0);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar60;
  local_2400._0_4_ = fVar60;
  local_2400._8_4_ = fVar60;
  local_2400._12_4_ = fVar60;
  local_2400._16_4_ = fVar60;
  local_2400._20_4_ = fVar60;
  local_2400._24_4_ = fVar60;
  local_2400._28_4_ = fVar60;
  auVar62 = ZEXT3264(local_2400);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2848 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = local_2848 ^ 0x20;
  iVar25 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT3264(CONCAT428(iVar25,CONCAT424(iVar25,CONCAT420(iVar25,CONCAT416(iVar25,CONCAT412(
                                                  iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25)))))
                                               )));
  local_2420._8_4_ = 0x80000000;
  local_2420._0_8_ = 0x8000000080000000;
  local_2420._12_4_ = 0x80000000;
  local_2420._16_4_ = 0x80000000;
  local_2420._20_4_ = 0x80000000;
  local_2420._24_4_ = 0x80000000;
  local_2420._28_4_ = 0x80000000;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar66 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar71 = ZEXT3264(local_2460);
  iVar25 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar25;
  local_2480._0_4_ = iVar25;
  local_2480._8_4_ = iVar25;
  local_2480._12_4_ = iVar25;
  local_2480._16_4_ = iVar25;
  local_2480._20_4_ = iVar25;
  local_2480._24_4_ = iVar25;
  local_2480._28_4_ = iVar25;
  auVar74 = ZEXT3264(local_2480);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_24a0._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_24a0._8_4_ = -fVar60;
  local_24a0._12_4_ = -fVar60;
  local_24a0._16_4_ = -fVar60;
  local_24a0._20_4_ = -fVar60;
  local_24a0._24_4_ = -fVar60;
  local_24a0._28_4_ = -fVar60;
  auVar78 = ZEXT3264(local_24a0);
  local_2838 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = 0x3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar51._16_4_ = 0x3f800000;
  auVar51._20_4_ = 0x3f800000;
  auVar51._24_4_ = 0x3f800000;
  auVar51._28_4_ = 0x3f800000;
  auVar58._8_4_ = 0xbf800000;
  auVar58._0_8_ = 0xbf800000bf800000;
  auVar58._12_4_ = 0xbf800000;
  auVar58._16_4_ = 0xbf800000;
  auVar58._20_4_ = 0xbf800000;
  auVar58._24_4_ = 0xbf800000;
  auVar58._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar51,auVar58,local_24c0);
LAB_01669cd4:
  do {
    do {
      if (pauVar38 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar30 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar30 + 8));
    uVar31 = *(ulong *)*pauVar38;
    while ((uVar31 & 8) == 0) {
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar36),auVar66._0_32_,
                                auVar84._0_32_);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + local_2848),auVar71._0_32_,
                                auVar59._0_32_);
      auVar58 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar48));
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar35),auVar78._0_32_,
                                auVar62._0_32_);
      auVar51 = vpmaxsd_avx2(ZEXT1632(auVar44),auVar74._0_32_);
      local_2700 = vpmaxsd_avx2(auVar58,auVar51);
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar36 ^ 0x20)),
                                auVar66._0_32_,auVar84._0_32_);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar37),auVar71._0_32_,
                                auVar59._0_32_);
      auVar58 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar48));
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar35 ^ 0x20)),
                                auVar78._0_32_,auVar62._0_32_);
      auVar51 = vpminsd_avx2(ZEXT1632(auVar44),auVar43._0_32_);
      auVar58 = vpminsd_avx2(auVar58,auVar51);
      auVar58 = vpcmpgtd_avx2(local_2700,auVar58);
      iVar25 = vmovmskps_avx(auVar58);
      if (iVar25 == 0xff) goto LAB_01669cd4;
      bVar24 = ~(byte)iVar25;
      uVar33 = uVar31 & 0xfffffffffffffff0;
      lVar32 = 0;
      for (uVar31 = (ulong)bVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar31 = *(ulong *)(uVar33 + lVar32 * 8);
      uVar26 = bVar24 - 1 & (uint)bVar24;
      uVar28 = (ulong)uVar26;
      if (uVar26 != 0) {
        uVar27 = *(uint *)(local_2700 + lVar32 * 4);
        lVar32 = 0;
        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar29 = (ulong)uVar26;
        uVar28 = *(ulong *)(uVar33 + lVar32 * 8);
        uVar67 = *(uint *)(local_2700 + lVar32 * 4);
        if (uVar26 == 0) {
          if (uVar27 < uVar67) {
            *(ulong *)*pauVar38 = uVar28;
            *(uint *)(*pauVar38 + 8) = uVar67;
            pauVar38 = pauVar38 + 1;
          }
          else {
            *(ulong *)*pauVar38 = uVar31;
            *(uint *)(*pauVar38 + 8) = uVar27;
            uVar31 = uVar28;
            pauVar38 = pauVar38 + 1;
          }
        }
        else {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar31;
          auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar27));
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar28;
          auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar67));
          lVar32 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar31 = (ulong)uVar26;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
          auVar45 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_2700 + lVar32 * 4)));
          auVar50 = vpcmpgtd_avx(auVar48,auVar44);
          if (uVar26 == 0) {
            auVar54 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar48,auVar44,auVar54);
            auVar44 = vblendvps_avx(auVar44,auVar48,auVar54);
            auVar48 = vpcmpgtd_avx(auVar45,auVar50);
            auVar54 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar45,auVar50,auVar54);
            auVar50 = vblendvps_avx(auVar50,auVar45,auVar54);
            auVar45 = vpcmpgtd_avx(auVar50,auVar44);
            auVar54 = vpshufd_avx(auVar45,0xaa);
            auVar45 = vblendvps_avx(auVar50,auVar44,auVar54);
            auVar44 = vblendvps_avx(auVar44,auVar50,auVar54);
            *pauVar38 = auVar44;
            pauVar38[1] = auVar45;
            uVar31 = auVar48._0_8_;
            pauVar38 = pauVar38 + 2;
          }
          else {
            lVar32 = 0;
            for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar31 = (ulong)uVar26;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
            auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2700 + lVar32 * 4)));
            if (uVar26 == 0) {
              auVar39 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar48,auVar44,auVar39);
              auVar44 = vblendvps_avx(auVar44,auVar48,auVar39);
              auVar48 = vpcmpgtd_avx(auVar54,auVar45);
              auVar39 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar54,auVar45,auVar39);
              auVar45 = vblendvps_avx(auVar45,auVar54,auVar39);
              auVar54 = vpcmpgtd_avx(auVar45,auVar44);
              auVar39 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar45,auVar44,auVar39);
              auVar44 = vblendvps_avx(auVar44,auVar45,auVar39);
              auVar45 = vpcmpgtd_avx(auVar48,auVar50);
              auVar39 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar48,auVar50,auVar39);
              auVar48 = vblendvps_avx(auVar50,auVar48,auVar39);
              auVar50 = vpcmpgtd_avx(auVar54,auVar48);
              auVar39 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar54,auVar48,auVar39);
              auVar48 = vblendvps_avx(auVar48,auVar54,auVar39);
              *pauVar38 = auVar44;
              pauVar38[1] = auVar48;
              pauVar38[2] = auVar50;
              uVar31 = auVar45._0_8_;
              pauVar38 = pauVar38 + 3;
            }
            else {
              *pauVar38 = auVar44;
              pauVar38[1] = auVar48;
              pauVar38[2] = auVar45;
              pauVar30 = pauVar38 + 3;
              pauVar38[3] = auVar54;
              do {
                lVar32 = 0;
                for (uVar28 = uVar31; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  lVar32 = lVar32 + 1;
                }
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
                auVar44 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2700 + lVar32 * 4)));
                pauVar30[1] = auVar44;
                pauVar30 = pauVar30 + 1;
                uVar31 = uVar31 - 1 & uVar31;
              } while (uVar31 != 0);
              lVar32 = 0;
              while (pauVar30 != pauVar38) {
                auVar44 = pauVar38[1];
                uVar26 = vextractps_avx(auVar44,2);
                for (lVar34 = 0x10;
                    (lVar32 != lVar34 && (*(uint *)(pauVar38[-1] + lVar34 + 8) < uVar26));
                    lVar34 = lVar34 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar38 + lVar34) =
                       *(undefined1 (*) [16])(pauVar38[-1] + lVar34);
                }
                *(undefined1 (*) [16])(*pauVar38 + lVar34) = auVar44;
                lVar32 = lVar32 + -0x10;
                pauVar38 = pauVar38 + 1;
              }
              uVar31 = *(ulong *)*pauVar30;
              pauVar38 = pauVar30;
            }
          }
        }
      }
    }
    local_2850 = (ulong)((uint)uVar31 & 0xf) - 8;
    uVar31 = uVar31 & 0xfffffffffffffff0;
    for (local_2858 = 0; local_2858 != local_2850; local_2858 = local_2858 + 1) {
      lVar34 = local_2858 * 0xe0;
      lVar32 = uVar31 + 0xd0 + lVar34;
      local_27c0 = *(undefined8 *)(lVar32 + 0x10);
      uStack_27b8 = *(undefined8 *)(lVar32 + 0x18);
      lVar32 = uVar31 + 0xc0 + lVar34;
      local_23c0 = *(undefined8 *)(lVar32 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar32 + 0x18);
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      uStack_27b0 = local_27c0;
      uStack_27a8 = uStack_27b8;
      auVar52._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x60 + lVar34);
      auVar52._0_16_ = *(undefined1 (*) [16])(uVar31 + lVar34);
      auVar55._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x70 + lVar34);
      auVar55._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x10 + lVar34);
      auVar57._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x80 + lVar34);
      auVar57._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x20 + lVar34);
      auVar44 = *(undefined1 (*) [16])(uVar31 + 0x30 + lVar34);
      auVar40._16_16_ = auVar44;
      auVar40._0_16_ = auVar44;
      auVar48 = *(undefined1 (*) [16])(uVar31 + 0x40 + lVar34);
      auVar46._16_16_ = auVar48;
      auVar46._0_16_ = auVar48;
      auVar50 = *(undefined1 (*) [16])(uVar31 + 0x50 + lVar34);
      auVar49._16_16_ = auVar50;
      auVar49._0_16_ = auVar50;
      auVar50 = *(undefined1 (*) [16])(uVar31 + 0x90 + lVar34);
      auVar53._16_16_ = auVar50;
      auVar53._0_16_ = auVar50;
      auVar50 = *(undefined1 (*) [16])(uVar31 + 0xa0 + lVar34);
      auVar69._16_16_ = auVar50;
      auVar69._0_16_ = auVar50;
      auVar50 = *(undefined1 (*) [16])(uVar31 + 0xb0 + lVar34);
      auVar72._16_16_ = auVar50;
      auVar72._0_16_ = auVar50;
      auVar51 = vsubps_avx(auVar52,auVar40);
      auVar58 = vsubps_avx(auVar55,auVar46);
      auVar11 = vsubps_avx(auVar57,auVar49);
      auVar40 = vsubps_avx(auVar53,auVar52);
      auVar12 = vsubps_avx(auVar69,auVar55);
      auVar13 = vsubps_avx(auVar72,auVar57);
      auVar14._4_4_ = auVar58._4_4_ * auVar13._4_4_;
      auVar14._0_4_ = auVar58._0_4_ * auVar13._0_4_;
      auVar14._8_4_ = auVar58._8_4_ * auVar13._8_4_;
      auVar14._12_4_ = auVar58._12_4_ * auVar13._12_4_;
      auVar14._16_4_ = auVar58._16_4_ * auVar13._16_4_;
      auVar14._20_4_ = auVar58._20_4_ * auVar13._20_4_;
      auVar14._24_4_ = auVar58._24_4_ * auVar13._24_4_;
      auVar14._28_4_ = auVar44._12_4_;
      auVar45 = vfmsub231ps_fma(auVar14,auVar12,auVar11);
      uVar79 = *(undefined4 *)(ray + k * 4);
      auVar75._4_4_ = uVar79;
      auVar75._0_4_ = uVar79;
      auVar75._8_4_ = uVar79;
      auVar75._12_4_ = uVar79;
      auVar75._16_4_ = uVar79;
      auVar75._20_4_ = uVar79;
      auVar75._24_4_ = uVar79;
      auVar75._28_4_ = uVar79;
      uVar79 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar80._4_4_ = uVar79;
      auVar80._0_4_ = uVar79;
      auVar80._8_4_ = uVar79;
      auVar80._12_4_ = uVar79;
      auVar80._16_4_ = uVar79;
      auVar80._20_4_ = uVar79;
      auVar80._24_4_ = uVar79;
      auVar80._28_4_ = uVar79;
      uVar79 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar82._4_4_ = uVar79;
      auVar82._0_4_ = uVar79;
      auVar82._8_4_ = uVar79;
      auVar82._12_4_ = uVar79;
      auVar82._16_4_ = uVar79;
      auVar82._20_4_ = uVar79;
      auVar82._24_4_ = uVar79;
      auVar82._28_4_ = uVar79;
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar70._4_4_ = fVar1;
      auVar70._0_4_ = fVar1;
      auVar70._8_4_ = fVar1;
      auVar70._12_4_ = fVar1;
      auVar70._16_4_ = fVar1;
      auVar70._20_4_ = fVar1;
      auVar70._24_4_ = fVar1;
      auVar70._28_4_ = fVar1;
      auVar15._4_4_ = auVar11._4_4_ * auVar40._4_4_;
      auVar15._0_4_ = auVar11._0_4_ * auVar40._0_4_;
      auVar15._8_4_ = auVar11._8_4_ * auVar40._8_4_;
      auVar15._12_4_ = auVar11._12_4_ * auVar40._12_4_;
      auVar15._16_4_ = auVar11._16_4_ * auVar40._16_4_;
      auVar15._20_4_ = auVar11._20_4_ * auVar40._20_4_;
      auVar15._24_4_ = auVar11._24_4_ * auVar40._24_4_;
      auVar15._28_4_ = auVar48._12_4_;
      auVar14 = vsubps_avx(auVar52,auVar75);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar76._4_4_ = fVar2;
      auVar76._0_4_ = fVar2;
      auVar76._8_4_ = fVar2;
      auVar76._12_4_ = fVar2;
      auVar76._16_4_ = fVar2;
      auVar76._20_4_ = fVar2;
      auVar76._24_4_ = fVar2;
      auVar76._28_4_ = fVar2;
      auVar54 = vfmsub231ps_fma(auVar15,auVar13,auVar51);
      auVar15 = vsubps_avx(auVar55,auVar80);
      fVar60 = *(float *)(ray + k * 4 + 0x60);
      auVar81._4_4_ = fVar60;
      auVar81._0_4_ = fVar60;
      auVar81._8_4_ = fVar60;
      auVar81._12_4_ = fVar60;
      auVar81._16_4_ = fVar60;
      auVar81._20_4_ = fVar60;
      auVar81._24_4_ = fVar60;
      auVar81._28_4_ = fVar60;
      auVar46 = vsubps_avx(auVar57,auVar82);
      auVar17._4_4_ = fVar1 * auVar15._4_4_;
      auVar17._0_4_ = fVar1 * auVar15._0_4_;
      auVar17._8_4_ = fVar1 * auVar15._8_4_;
      auVar17._12_4_ = fVar1 * auVar15._12_4_;
      auVar17._16_4_ = fVar1 * auVar15._16_4_;
      auVar17._20_4_ = fVar1 * auVar15._20_4_;
      auVar17._24_4_ = fVar1 * auVar15._24_4_;
      auVar17._28_4_ = uVar79;
      auVar44 = vfmsub231ps_fma(auVar17,auVar14,auVar76);
      auVar18._4_4_ = auVar13._4_4_ * auVar44._4_4_;
      auVar18._0_4_ = auVar13._0_4_ * auVar44._0_4_;
      auVar18._8_4_ = auVar13._8_4_ * auVar44._8_4_;
      auVar18._12_4_ = auVar13._12_4_ * auVar44._12_4_;
      auVar18._16_4_ = auVar13._16_4_ * 0.0;
      auVar18._20_4_ = auVar13._20_4_ * 0.0;
      auVar18._24_4_ = auVar13._24_4_ * 0.0;
      auVar18._28_4_ = auVar13._28_4_;
      auVar83._0_4_ = auVar11._0_4_ * auVar44._0_4_;
      auVar83._4_4_ = auVar11._4_4_ * auVar44._4_4_;
      auVar83._8_4_ = auVar11._8_4_ * auVar44._8_4_;
      auVar83._12_4_ = auVar11._12_4_ * auVar44._12_4_;
      auVar83._16_4_ = auVar11._16_4_ * 0.0;
      auVar83._20_4_ = auVar11._20_4_ * 0.0;
      auVar83._24_4_ = auVar11._24_4_ * 0.0;
      auVar83._28_4_ = 0;
      auVar13._4_4_ = fVar60 * auVar14._4_4_;
      auVar13._0_4_ = fVar60 * auVar14._0_4_;
      auVar13._8_4_ = fVar60 * auVar14._8_4_;
      auVar13._12_4_ = fVar60 * auVar14._12_4_;
      auVar13._16_4_ = fVar60 * auVar14._16_4_;
      auVar13._20_4_ = fVar60 * auVar14._20_4_;
      auVar13._24_4_ = fVar60 * auVar14._24_4_;
      auVar13._28_4_ = auVar11._28_4_;
      auVar48 = vfmsub231ps_fma(auVar13,auVar46,auVar70);
      auVar44 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar48),auVar12);
      auVar48 = vfmadd231ps_fma(auVar83,auVar58,ZEXT1632(auVar48));
      auVar11._4_4_ = auVar51._4_4_ * auVar12._4_4_;
      auVar11._0_4_ = auVar51._0_4_ * auVar12._0_4_;
      auVar11._8_4_ = auVar51._8_4_ * auVar12._8_4_;
      auVar11._12_4_ = auVar51._12_4_ * auVar12._12_4_;
      auVar11._16_4_ = auVar51._16_4_ * auVar12._16_4_;
      auVar11._20_4_ = auVar51._20_4_ * auVar12._20_4_;
      auVar11._24_4_ = auVar51._24_4_ * auVar12._24_4_;
      auVar11._28_4_ = auVar12._28_4_;
      auVar39 = vfmsub231ps_fma(auVar11,auVar40,auVar58);
      auVar12._4_4_ = fVar2 * auVar46._4_4_;
      auVar12._0_4_ = fVar2 * auVar46._0_4_;
      auVar12._8_4_ = fVar2 * auVar46._8_4_;
      auVar12._12_4_ = fVar2 * auVar46._12_4_;
      auVar12._16_4_ = fVar2 * auVar46._16_4_;
      auVar12._20_4_ = fVar2 * auVar46._20_4_;
      auVar12._24_4_ = fVar2 * auVar46._24_4_;
      auVar12._28_4_ = auVar58._28_4_;
      auVar16 = vfmsub231ps_fma(auVar12,auVar15,auVar81);
      fVar1 = auVar39._0_4_;
      fVar2 = auVar39._4_4_;
      auVar19._4_4_ = fVar60 * fVar2;
      auVar19._0_4_ = fVar60 * fVar1;
      fVar6 = auVar39._8_4_;
      auVar19._8_4_ = fVar60 * fVar6;
      fVar7 = auVar39._12_4_;
      auVar19._12_4_ = fVar60 * fVar7;
      auVar19._16_4_ = fVar60 * 0.0;
      auVar19._20_4_ = fVar60 * 0.0;
      auVar19._24_4_ = fVar60 * 0.0;
      auVar19._28_4_ = fVar60;
      auVar50 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar54),auVar76);
      auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),ZEXT1632(auVar45),auVar70);
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),ZEXT1632(auVar16),auVar40);
      auVar58 = vandps_avx(ZEXT1632(auVar50),local_2420);
      uVar26 = auVar58._0_4_;
      local_2700._0_4_ = (float)(uVar26 ^ auVar44._0_4_);
      uVar27 = auVar58._4_4_;
      local_2700._4_4_ = (float)(uVar27 ^ auVar44._4_4_);
      uVar67 = auVar58._8_4_;
      local_2700._8_4_ = (float)(uVar67 ^ auVar44._8_4_);
      uVar68 = auVar58._12_4_;
      local_2700._12_4_ = (float)(uVar68 ^ auVar44._12_4_);
      local_26c0._16_4_ = auVar58._16_4_;
      local_2700._16_4_ = local_26c0._16_4_;
      local_26c0._20_4_ = auVar58._20_4_;
      local_2700._20_4_ = local_26c0._20_4_;
      local_26c0._24_4_ = auVar58._24_4_;
      local_2700._24_4_ = local_26c0._24_4_;
      local_26c0._28_4_ = auVar58._28_4_;
      local_2700._28_4_ = local_26c0._28_4_;
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar51,ZEXT1632(auVar16));
      local_26e0._0_4_ = (float)(uVar26 ^ auVar44._0_4_);
      local_26e0._4_4_ = (float)(uVar27 ^ auVar44._4_4_);
      local_26e0._8_4_ = (float)(uVar67 ^ auVar44._8_4_);
      local_26e0._12_4_ = (float)(uVar68 ^ auVar44._12_4_);
      local_26e0._16_4_ = local_26c0._16_4_;
      local_26e0._20_4_ = local_26c0._20_4_;
      local_26e0._24_4_ = local_26c0._24_4_;
      local_26e0._28_4_ = local_26c0._28_4_;
      auVar58 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
      auVar51 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
      auVar58 = vandps_avx(auVar58,auVar51);
      auVar61._8_4_ = 0x7fffffff;
      auVar61._0_8_ = 0x7fffffff7fffffff;
      auVar61._12_4_ = 0x7fffffff;
      auVar61._16_4_ = 0x7fffffff;
      auVar61._20_4_ = 0x7fffffff;
      auVar61._24_4_ = 0x7fffffff;
      auVar61._28_4_ = 0x7fffffff;
      local_26a0 = vandps_avx(ZEXT1632(auVar50),auVar61);
      auVar51 = vcmpps_avx(ZEXT1632(auVar50),ZEXT832(0) << 0x20,4);
      auVar58 = vandps_avx(auVar58,auVar51);
      auVar73._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
      auVar73._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
      auVar73._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
      auVar73._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
      auVar73._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
      auVar73._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
      auVar73._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
      auVar73._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
      auVar51 = vcmpps_avx(auVar73,local_26a0,2);
      auVar11 = auVar51 & auVar58;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar58 = vandps_avx(auVar58,auVar51);
        auVar44 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
        auVar20._4_4_ = fVar2 * auVar46._4_4_;
        auVar20._0_4_ = fVar1 * auVar46._0_4_;
        auVar20._8_4_ = fVar6 * auVar46._8_4_;
        auVar20._12_4_ = fVar7 * auVar46._12_4_;
        auVar20._16_4_ = auVar46._16_4_ * 0.0;
        auVar20._20_4_ = auVar46._20_4_ * 0.0;
        auVar20._24_4_ = auVar46._24_4_ * 0.0;
        auVar20._28_4_ = auVar46._28_4_;
        auVar48 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar54),auVar20);
        auVar48 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar45),ZEXT1632(auVar48));
        local_26c0._0_4_ = (float)(uVar26 ^ auVar48._0_4_);
        local_26c0._4_4_ = (float)(uVar27 ^ auVar48._4_4_);
        local_26c0._8_4_ = (float)(uVar67 ^ auVar48._8_4_);
        local_26c0._12_4_ = (float)(uVar68 ^ auVar48._12_4_);
        fVar60 = *(float *)(ray + k * 4 + 0x30);
        auVar21._4_4_ = local_26a0._4_4_ * fVar60;
        auVar21._0_4_ = local_26a0._0_4_ * fVar60;
        auVar21._8_4_ = local_26a0._8_4_ * fVar60;
        auVar21._12_4_ = local_26a0._12_4_ * fVar60;
        auVar21._16_4_ = local_26a0._16_4_ * fVar60;
        auVar21._20_4_ = local_26a0._20_4_ * fVar60;
        auVar21._24_4_ = local_26a0._24_4_ * fVar60;
        auVar21._28_4_ = fVar60;
        auVar58 = vcmpps_avx(auVar21,local_26c0,1);
        fVar60 = *(float *)(ray + k * 4 + 0x80);
        auVar43 = ZEXT3264(CONCAT428(fVar60,CONCAT424(fVar60,CONCAT420(fVar60,CONCAT416(fVar60,
                                                  CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,
                                                  fVar60))))))));
        auVar56._0_4_ = local_26a0._0_4_ * fVar60;
        auVar56._4_4_ = local_26a0._4_4_ * fVar60;
        auVar56._8_4_ = local_26a0._8_4_ * fVar60;
        auVar56._12_4_ = local_26a0._12_4_ * fVar60;
        auVar56._16_4_ = local_26a0._16_4_ * fVar60;
        auVar56._20_4_ = local_26a0._20_4_ * fVar60;
        auVar56._24_4_ = local_26a0._24_4_ * fVar60;
        auVar56._28_4_ = 0;
        auVar51 = vcmpps_avx(local_26c0,auVar56,2);
        auVar58 = vandps_avx(auVar58,auVar51);
        auVar48 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
        auVar44 = vpand_avx(auVar44,auVar48);
        auVar58 = vpmovzxwd_avx2(auVar44);
        auVar58 = vpslld_avx2(auVar58,0x1f);
        if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar58 >> 0x7f,0) != '\0') ||
              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar58 >> 0xbf,0) != '\0') ||
            (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar58[0x1f] < '\0') {
          local_2800 = vpsrad_avx2(auVar58,0x1f);
          local_2680 = ZEXT1632(auVar45);
          local_2660 = ZEXT1632(auVar54);
          local_2640 = ZEXT1632(auVar39);
          local_2620 = local_2800;
          local_2540 = local_24c0;
          local_2840 = context->scene;
          auVar51 = vrcpps_avx(local_26a0);
          auVar77._8_4_ = 0x3f800000;
          auVar77._0_8_ = 0x3f8000003f800000;
          auVar77._12_4_ = 0x3f800000;
          auVar77._16_4_ = 0x3f800000;
          auVar77._20_4_ = 0x3f800000;
          auVar77._24_4_ = 0x3f800000;
          auVar77._28_4_ = 0x3f800000;
          auVar48 = vfnmadd213ps_fma(local_26a0,auVar51,auVar77);
          auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar51,auVar51);
          fVar60 = auVar48._0_4_;
          fVar63 = auVar48._4_4_;
          local_25c0._4_4_ = fVar63 * local_26c0._4_4_;
          local_25c0._0_4_ = fVar60 * local_26c0._0_4_;
          fVar64 = auVar48._8_4_;
          local_25c0._8_4_ = fVar64 * local_26c0._8_4_;
          fVar65 = auVar48._12_4_;
          local_25c0._12_4_ = fVar65 * local_26c0._12_4_;
          local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
          local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
          local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
          local_25c0._28_4_ = auVar51._28_4_;
          auVar59 = ZEXT3264(local_25c0);
          auVar22._4_4_ = fVar63 * local_2700._4_4_;
          auVar22._0_4_ = fVar60 * local_2700._0_4_;
          auVar22._8_4_ = fVar64 * local_2700._8_4_;
          auVar22._12_4_ = fVar65 * local_2700._12_4_;
          auVar22._16_4_ = local_26c0._16_4_ * 0.0;
          auVar22._20_4_ = local_26c0._20_4_ * 0.0;
          auVar22._24_4_ = local_26c0._24_4_ * 0.0;
          auVar22._28_4_ = local_26c0._28_4_;
          auVar51 = vminps_avx(auVar22,auVar77);
          auVar23._4_4_ = fVar63 * local_26e0._4_4_;
          auVar23._0_4_ = fVar60 * local_26e0._0_4_;
          auVar23._8_4_ = fVar64 * local_26e0._8_4_;
          auVar23._12_4_ = fVar65 * local_26e0._12_4_;
          auVar23._16_4_ = local_26c0._16_4_ * 0.0;
          auVar23._20_4_ = local_26c0._20_4_ * 0.0;
          auVar23._24_4_ = local_26c0._24_4_ * 0.0;
          auVar23._28_4_ = local_26c0._28_4_;
          auVar11 = vminps_avx(auVar23,auVar77);
          auVar40 = vsubps_avx(auVar77,auVar51);
          auVar12 = vsubps_avx(auVar77,auVar11);
          local_25e0 = vblendvps_avx(auVar11,auVar40,local_24c0);
          local_2600 = vblendvps_avx(auVar51,auVar12,local_24c0);
          fVar60 = local_24e0._0_4_;
          local_25a0._0_4_ = auVar45._0_4_ * fVar60;
          fVar63 = local_24e0._4_4_;
          local_25a0._4_4_ = auVar45._4_4_ * fVar63;
          fVar64 = local_24e0._8_4_;
          local_25a0._8_4_ = auVar45._8_4_ * fVar64;
          fVar65 = local_24e0._12_4_;
          local_25a0._12_4_ = auVar45._12_4_ * fVar65;
          fVar8 = local_24e0._16_4_;
          local_25a0._16_4_ = fVar8 * 0.0;
          fVar9 = local_24e0._20_4_;
          local_25a0._20_4_ = fVar9 * 0.0;
          fVar10 = local_24e0._24_4_;
          local_25a0._24_4_ = fVar10 * 0.0;
          local_25a0._28_4_ = 0;
          local_2580._0_4_ = fVar60 * auVar54._0_4_;
          local_2580._4_4_ = fVar63 * auVar54._4_4_;
          local_2580._8_4_ = fVar64 * auVar54._8_4_;
          local_2580._12_4_ = fVar65 * auVar54._12_4_;
          local_2580._16_4_ = fVar8 * 0.0;
          local_2580._20_4_ = fVar9 * 0.0;
          local_2580._24_4_ = fVar10 * 0.0;
          local_2580._28_4_ = 0;
          local_2560._0_4_ = fVar60 * fVar1;
          local_2560._4_4_ = fVar63 * fVar2;
          local_2560._8_4_ = fVar64 * fVar6;
          local_2560._12_4_ = fVar65 * fVar7;
          local_2560._16_4_ = fVar8 * 0.0;
          local_2560._20_4_ = fVar9 * 0.0;
          local_2560._24_4_ = fVar10 * 0.0;
          local_2560._28_4_ = 0;
          auVar41._8_4_ = 0x7f800000;
          auVar41._0_8_ = 0x7f8000007f800000;
          auVar41._12_4_ = 0x7f800000;
          auVar41._16_4_ = 0x7f800000;
          auVar41._20_4_ = 0x7f800000;
          auVar41._24_4_ = 0x7f800000;
          auVar41._28_4_ = 0x7f800000;
          auVar58 = vblendvps_avx(auVar41,local_25c0,auVar58);
          auVar51 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar51 = vminps_avx(auVar58,auVar51);
          auVar11 = vshufpd_avx(auVar51,auVar51,5);
          auVar51 = vminps_avx(auVar51,auVar11);
          auVar11 = vpermpd_avx2(auVar51,0x4e);
          auVar51 = vminps_avx(auVar51,auVar11);
          auVar58 = vcmpps_avx(auVar58,auVar51,0);
          auVar48 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          auVar44 = vpand_avx(auVar48,auVar44);
          auVar58 = vpmovzxwd_avx2(auVar44);
          auVar58 = vpslld_avx2(auVar58,0x1f);
          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar58 >> 0x7f,0) == '\0') &&
                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar58 >> 0xbf,0) == '\0') &&
              (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar58[0x1f]) {
            auVar58 = local_2800;
          }
          uVar27 = vmovmskps_avx(auVar58);
          uVar26 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
            uVar26 = uVar26 + 1;
          }
          do {
            uVar33 = (ulong)uVar26;
            uVar26 = *(uint *)((long)&local_23c0 + uVar33 * 4);
            pGVar4 = (local_2840->geometries).items[uVar26].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2800 + uVar33 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar79 = *(undefined4 *)(local_2600 + uVar33 * 4);
                uVar3 = *(undefined4 *)(local_25e0 + uVar33 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar33 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25a0 + uVar33 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar33 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2560 + uVar33 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar79;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_27c0 + uVar33 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar26;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_2520 = auVar59._0_32_;
              local_27e0 = auVar43._0_32_;
              local_2500 = auVar84._0_32_;
              uVar79 = *(undefined4 *)(local_2600 + uVar33 * 4);
              local_2760._4_4_ = uVar79;
              local_2760._0_4_ = uVar79;
              local_2760._8_4_ = uVar79;
              local_2760._12_4_ = uVar79;
              local_2750 = *(undefined4 *)(local_25e0 + uVar33 * 4);
              local_2730._4_4_ = uVar26;
              local_2730._0_4_ = uVar26;
              local_2730._8_4_ = uVar26;
              local_2730._12_4_ = uVar26;
              uVar79 = *(undefined4 *)((long)&local_27c0 + uVar33 * 4);
              local_2740._4_4_ = uVar79;
              local_2740._0_4_ = uVar79;
              local_2740._8_4_ = uVar79;
              local_2740._12_4_ = uVar79;
              uVar79 = *(undefined4 *)(local_25a0 + uVar33 * 4);
              uVar3 = *(undefined4 *)(local_2580 + uVar33 * 4);
              local_2780._4_4_ = uVar3;
              local_2780._0_4_ = uVar3;
              local_2780._8_4_ = uVar3;
              local_2780._12_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_2560 + uVar33 * 4);
              local_2770._4_4_ = uVar3;
              local_2770._0_4_ = uVar3;
              local_2770._8_4_ = uVar3;
              local_2770._12_4_ = uVar3;
              local_2790[0] = (RTCHitN)(char)uVar79;
              local_2790[1] = (RTCHitN)(char)((uint)uVar79 >> 8);
              local_2790[2] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
              local_2790[3] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
              local_2790[4] = (RTCHitN)(char)uVar79;
              local_2790[5] = (RTCHitN)(char)((uint)uVar79 >> 8);
              local_2790[6] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
              local_2790[7] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
              local_2790[8] = (RTCHitN)(char)uVar79;
              local_2790[9] = (RTCHitN)(char)((uint)uVar79 >> 8);
              local_2790[10] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
              local_2790[0xb] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
              local_2790[0xc] = (RTCHitN)(char)uVar79;
              local_2790[0xd] = (RTCHitN)(char)((uint)uVar79 >> 8);
              local_2790[0xe] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
              local_2790[0xf] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
              uStack_274c = local_2750;
              uStack_2748 = local_2750;
              uStack_2744 = local_2750;
              vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
              uStack_271c = context->user->instID[0];
              local_2720 = uStack_271c;
              uStack_2718 = uStack_271c;
              uStack_2714 = uStack_271c;
              uStack_2710 = context->user->instPrimID[0];
              uStack_270c = uStack_2710;
              uStack_2708 = uStack_2710;
              uStack_2704 = uStack_2710;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar33 * 4);
              local_2870 = *local_2838;
              local_2830.valid = (int *)local_2870;
              local_2830.geometryUserPtr = pGVar4->userPtr;
              local_2830.context = context->user;
              local_2830.hit = local_2790;
              local_2830.N = 4;
              local_2830.ray = (RTCRayN *)ray;
              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->intersectionFilterN)(&local_2830);
              }
              if (local_2870 == (undefined1  [16])0x0) {
                auVar44 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar44 = auVar44 ^ _DAT_01f46b70;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&local_2830);
                }
                auVar48 = vpcmpeqd_avx(local_2870,_DAT_01f45a50);
                auVar44 = auVar48 ^ _DAT_01f46b70;
                if (local_2870 != (undefined1  [16])0x0) {
                  auVar48 = auVar48 ^ _DAT_01f46b70;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])local_2830.hit);
                  *(undefined1 (*) [16])(local_2830.ray + 0xc0) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x10));
                  *(undefined1 (*) [16])(local_2830.ray + 0xd0) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x20));
                  *(undefined1 (*) [16])(local_2830.ray + 0xe0) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x30));
                  *(undefined1 (*) [16])(local_2830.ray + 0xf0) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x40));
                  *(undefined1 (*) [16])(local_2830.ray + 0x100) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x50));
                  *(undefined1 (*) [16])(local_2830.ray + 0x110) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x60));
                  *(undefined1 (*) [16])(local_2830.ray + 0x120) = auVar50;
                  auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x70));
                  *(undefined1 (*) [16])(local_2830.ray + 0x130) = auVar50;
                  auVar48 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2830.hit + 0x80));
                  *(undefined1 (*) [16])(local_2830.ray + 0x140) = auVar48;
                }
              }
              auVar39._8_8_ = 0x100000001;
              auVar39._0_8_ = 0x100000001;
              if ((auVar39 & auVar44) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_27e0._0_4_;
              }
              else {
                local_27e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_2800 + uVar33 * 4) = 0;
              auVar43 = ZEXT3264(local_27e0);
              uVar79 = local_27e0._0_4_;
              auVar42._4_4_ = uVar79;
              auVar42._0_4_ = uVar79;
              auVar42._8_4_ = uVar79;
              auVar42._12_4_ = uVar79;
              auVar42._16_4_ = uVar79;
              auVar42._20_4_ = uVar79;
              auVar42._24_4_ = uVar79;
              auVar42._28_4_ = uVar79;
              auVar59 = ZEXT3264(local_2520);
              auVar58 = vcmpps_avx(local_2520,auVar42,2);
              local_2800 = vandps_avx(auVar58,local_2800);
              auVar84 = ZEXT3264(local_2500);
            }
            if ((((((((local_2800 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2800 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2800 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2800 >> 0x7f,0) == '\0') &&
                  (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2800 >> 0xbf,0) == '\0') &&
                (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2800[0x1f]) break;
            auVar47._8_4_ = 0x7f800000;
            auVar47._0_8_ = 0x7f8000007f800000;
            auVar47._12_4_ = 0x7f800000;
            auVar47._16_4_ = 0x7f800000;
            auVar47._20_4_ = 0x7f800000;
            auVar47._24_4_ = 0x7f800000;
            auVar47._28_4_ = 0x7f800000;
            auVar58 = vblendvps_avx(auVar47,auVar59._0_32_,local_2800);
            auVar51 = vshufps_avx(auVar58,auVar58,0xb1);
            auVar51 = vminps_avx(auVar58,auVar51);
            auVar11 = vshufpd_avx(auVar51,auVar51,5);
            auVar51 = vminps_avx(auVar51,auVar11);
            auVar11 = vpermpd_avx2(auVar51,0x4e);
            auVar51 = vminps_avx(auVar51,auVar11);
            auVar51 = vcmpps_avx(auVar58,auVar51,0);
            auVar11 = local_2800 & auVar51;
            auVar58 = local_2800;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar58 = vandps_avx(auVar51,local_2800);
            }
            uVar27 = vmovmskps_avx(auVar58);
            uVar26 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar26 = uVar26 + 1;
            }
          } while( true );
        }
      }
      auVar59 = ZEXT3264(local_23e0);
      auVar62 = ZEXT3264(local_2400);
      auVar66 = ZEXT3264(local_2440);
      auVar71 = ZEXT3264(local_2460);
      auVar74 = ZEXT3264(local_2480);
      auVar78 = ZEXT3264(local_24a0);
    }
    uVar79 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar43 = ZEXT3264(CONCAT428(uVar79,CONCAT424(uVar79,CONCAT420(uVar79,CONCAT416(uVar79,CONCAT412
                                                  (uVar79,CONCAT48(uVar79,CONCAT44(uVar79,uVar79))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }